

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitagg.cpp
# Opt level: O3

void duckdb::BitwiseOperation::
     Operation<duckdb::string_t,duckdb::BitState<duckdb::string_t>,duckdb::BitStringXorOperation>
               (BitState<duckdb::string_t> *state,string_t *input,AggregateUnaryInput *param_3)

{
  undefined4 uVar1;
  char *__src;
  char *__dest;
  anon_union_16_2_67f50693_for_value local_38;
  
  local_38._0_8_ = *(undefined8 *)&input->value;
  __src = (input->value).pointer.ptr;
  if (state->is_set == false) {
    if ((uint)local_38._0_8_ < 0xd) {
      *(undefined8 *)&(state->value).value = local_38._0_8_;
      __dest = __src;
    }
    else {
      __dest = (char *)operator_new__(local_38._0_8_ & 0xffffffff);
      switchD_015df945::default(__dest,__src,local_38._0_8_ & 0xffffffff);
      uVar1 = *(undefined4 *)__dest;
      (state->value).value.pointer.length = (uint)local_38._0_8_;
      *(undefined4 *)((long)&(state->value).value + 4) = uVar1;
    }
    (state->value).value.pointer.ptr = __dest;
    state->is_set = true;
  }
  else {
    local_38.pointer.ptr = __src;
    Bit::BitwiseXor((bitstring_t *)&local_38.pointer,&state->value,&state->value);
  }
  return;
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &) {
		if (!state.is_set) {
			OP::template Assign<INPUT_TYPE>(state, input);
			state.is_set = true;
		} else {
			OP::template Execute<INPUT_TYPE>(state, input);
		}
	}